

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxBoxCollisionAlgorithm.h
# Opt level: O2

void __thiscall
btBoxBoxCollisionAlgorithm::getAllContactManifolds
          (btBoxBoxCollisionAlgorithm *this,btManifoldArray *manifoldArray)

{
  if ((this->m_manifoldPtr != (btPersistentManifold *)0x0) && (this->m_ownManifold == true)) {
    btAlignedObjectArray<btPersistentManifold_*>::push_back(manifoldArray,&this->m_manifoldPtr);
    return;
  }
  return;
}

Assistant:

virtual	void	getAllContactManifolds(btManifoldArray&	manifoldArray)
	{
		if (m_manifoldPtr && m_ownManifold)
		{
			manifoldArray.push_back(m_manifoldPtr);
		}
	}